

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall
kratos::FSMState::next
          (FSMState *this,shared_ptr<kratos::FSMState> *next_state,shared_ptr<kratos::Var> *cond)

{
  pointer *pppVar1;
  FSMState *pFVar2;
  FSM *pFVar3;
  Var *pVVar4;
  pointer ppVar5;
  iterator __position;
  element_type *peVar6;
  FSM *pFVar7;
  int iVar8;
  UserException *pUVar9;
  VarException *this_00;
  runtime_error *this_01;
  FSM *pFVar10;
  pointer ppVar11;
  pointer ppVar12;
  long lVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar14;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_a8;
  FSMState *pFStack_a0;
  undefined1 local_88 [32];
  pointer local_68;
  size_type sStack_60;
  string local_58;
  allocator_type local_31;
  
  pFVar2 = (next_state->super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((pFVar2 == (FSMState *)0x0) || (pFVar3 = pFVar2->parent_, pFVar3 == (FSM *)0x0)) {
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = (this->parent_->fsm_name_)._M_dataplus._M_p;
    local_88._8_8_ = (this->parent_->fsm_name_)._M_string_length;
    local_88._16_8_ = (this->name_)._M_dataplus._M_p;
    local_88._24_8_ = (this->name_)._M_string_length;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x25;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_88;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_58,(detail *)"Next state for {0}.{1} cannot be null",format_str,args);
    UserException::UserException(pUVar9,&local_58);
    __cxa_throw(pUVar9,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar7 = this->parent_;
  do {
    pFVar10 = pFVar7;
    pFVar7 = pFVar10->parent_fsm_;
  } while (pFVar10->parent_fsm_ != (FSM *)0x0);
  bVar14 = pFVar3 != pFVar10;
  do {
    if (!bVar14) break;
    pFVar3 = pFVar3->parent_fsm_;
    bVar14 = pFVar3 != pFVar10;
  } while (pFVar3 != (FSM *)0x0);
  if (bVar14) {
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    peVar6 = (next_state->super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_88._0_8_ = (peVar6->name_)._M_dataplus._M_p;
    local_88._8_8_ = (peVar6->name_)._M_string_length;
    local_88._16_8_ = (peVar6->parent_->fsm_name_)._M_dataplus._M_p;
    local_88._24_8_ = (peVar6->parent_->fsm_name_)._M_string_length;
    local_68 = (pFVar10->fsm_name_)._M_dataplus._M_p;
    sStack_60 = (pFVar10->fsm_name_)._M_string_length;
    format_str_00.size_ = 0xddd;
    format_str_00.data_ = (char *)0x35;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_88;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_58,(detail *)"FSM state {0} belongs to a different FSM {1} than {2}",
               format_str_00,args_00);
    UserException::UserException(pUVar9,&local_58);
    __cxa_throw(pUVar9,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar4 = (cond->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88._8_8_ = pFVar2;
  if (pVVar4 == (Var *)0x0) {
    local_88._0_8_ = (Var *)0x0;
    std::
    vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
    ::emplace_back<std::pair<decltype(nullptr),kratos::FSMState*>>
              ((vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
                *)&this->transitions_,(pair<std::nullptr_t,_kratos::FSMState_*> *)local_88);
    return;
  }
  ppVar12 = (this->transitions_).
            super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->transitions_).
           super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)ppVar5 - (long)ppVar12 >> 6;
  ppVar11 = ppVar12;
  if (0 < lVar13) {
    ppVar11 = (pointer)((long)&ppVar12->first + ((long)ppVar5 - (long)ppVar12 & 0xffffffffffffffc0U)
                       );
    lVar13 = lVar13 + 1;
    ppVar12 = ppVar12 + 2;
    do {
      if (ppVar12[-2].first == (Var *)0x0) {
        ppVar12 = ppVar12 + -2;
        goto LAB_001de63b;
      }
      if (ppVar12[-1].first == (Var *)0x0) {
        ppVar12 = ppVar12 + -1;
        goto LAB_001de63b;
      }
      if (ppVar12->first == (Var *)0x0) goto LAB_001de63b;
      if (ppVar12[1].first == (Var *)0x0) {
        ppVar12 = ppVar12 + 1;
        goto LAB_001de63b;
      }
      lVar13 = lVar13 + -1;
      ppVar12 = ppVar12 + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)ppVar5 - (long)ppVar11 >> 4;
  if (lVar13 == 1) {
LAB_001de602:
    ppVar12 = ppVar11;
    if (ppVar11->first != (Var *)0x0) {
      ppVar12 = ppVar5;
    }
  }
  else if (lVar13 == 2) {
LAB_001de5f8:
    ppVar12 = ppVar11;
    if (ppVar11->first != (Var *)0x0) {
      ppVar11 = ppVar11 + 1;
      goto LAB_001de602;
    }
  }
  else {
    ppVar12 = ppVar5;
    if ((lVar13 == 3) && (ppVar12 = ppVar11, ppVar11->first != (Var *)0x0)) {
      ppVar11 = ppVar11 + 1;
      goto LAB_001de5f8;
    }
  }
LAB_001de63b:
  if (ppVar12 != ppVar5) {
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "Unconditional transition has been assign to ",&this->name_);
    UserException::UserException(pUVar9,(string *)local_88);
    __cxa_throw(pUVar9,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = (*(pVVar4->super_IRNode)._vptr_IRNode[7])(pVVar4);
  if (iVar8 != 1) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Condition has to be a boolean value","");
    __l._M_len = 1;
    __l._M_array = (iterator)&local_a8;
    local_a8 = pVVar4;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_58,
               __l,&local_31);
    VarException::VarException
              (this_00,(string *)local_88,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_58)
    ;
    __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar12 = (this->transitions_).
            super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->transitions_).
           super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)ppVar5 - (long)ppVar12 >> 6;
  ppVar11 = ppVar12;
  if (0 < lVar13) {
    ppVar11 = (pointer)((long)&ppVar12->first + ((long)ppVar5 - (long)ppVar12 & 0xffffffffffffffc0U)
                       );
    lVar13 = lVar13 + 1;
    ppVar12 = ppVar12 + 2;
    do {
      if (ppVar12[-2].first == pVVar4) {
        ppVar12 = ppVar12 + -2;
        goto LAB_001de6f5;
      }
      if (ppVar12[-1].first == pVVar4) {
        ppVar12 = ppVar12 + -1;
        goto LAB_001de6f5;
      }
      if (ppVar12->first == pVVar4) goto LAB_001de6f5;
      if (ppVar12[1].first == pVVar4) {
        ppVar12 = ppVar12 + 1;
        goto LAB_001de6f5;
      }
      lVar13 = lVar13 + -1;
      ppVar12 = ppVar12 + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)ppVar5 - (long)ppVar11 >> 4;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      ppVar12 = ppVar5;
      if ((lVar13 != 3) || (ppVar12 = ppVar11, ppVar11->first == pVVar4)) goto LAB_001de6f5;
      ppVar11 = ppVar11 + 1;
    }
    ppVar12 = ppVar11;
    if (ppVar11->first == pVVar4) goto LAB_001de6f5;
    ppVar11 = ppVar11 + 1;
  }
  ppVar12 = ppVar11;
  if (ppVar11->first != pVVar4) {
    ppVar12 = ppVar5;
  }
LAB_001de6f5:
  if (ppVar12 == ppVar5) {
    __position._M_current =
         (this->transitions_).
         super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->transitions_).
        super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_88._0_8_ = pVVar4;
      std::
      vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
      ::_M_realloc_insert<std::pair<kratos::Var*,kratos::FSMState*>>
                ((vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
                  *)&this->transitions_,__position,
                 (pair<kratos::Var_*,_kratos::FSMState_*> *)local_88);
    }
    else {
      (__position._M_current)->first = pVVar4;
      (__position._M_current)->second = pFVar2;
      pppVar1 = &(this->transitions_).
                 super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  (*(pVVar4->super_IRNode)._vptr_IRNode[0x1f])(&local_a8,pVVar4);
  local_88._16_8_ = (this->parent_->fsm_name_)._M_dataplus._M_p;
  local_88._24_8_ = (this->parent_->fsm_name_)._M_string_length;
  local_68 = (this->name_)._M_dataplus._M_p;
  sStack_60 = (this->name_)._M_string_length;
  local_88._0_8_ = local_a8;
  local_88._8_8_ = pFStack_a0;
  format_str_01.size_ = 0xddd;
  format_str_01.data_ = (char *)0x29;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_88;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_58,(detail *)"{0} has been added to FSM {1}-{2} already",format_str_01,args_01);
  std::runtime_error::runtime_error(this_01,(string *)&local_58);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FSMState::next(const std::shared_ptr<FSMState>& next_state, const std::shared_ptr<Var>& cond) {
    if (!next_state || !next_state->parent_)
        throw UserException(
            ::format("Next state for {0}.{1} cannot be null", parent_->fsm_name(), name_));
    // making sure that it's part of the same fsm state
    auto* parent = parent_;
    auto* state_ptr = next_state.get();
    while (parent->parent_fsm()) parent = parent->parent_fsm();
    auto* fsm = next_state->parent_;
    while (fsm && fsm != parent) {
        fsm = fsm->parent_fsm();
    }
    if (fsm != parent) {
        throw UserException(::format("FSM state {0} belongs to a different FSM {1} than {2}",
                                     next_state->name_, next_state->parent_->fsm_name(),
                                     parent->fsm_name()));
    }

    auto find_match = [this](Var *ptr) -> bool {
        auto it = std::find_if(transitions_.begin(), transitions_.end(), [ptr](auto const &pair) {
            return pair.first == ptr;
        });
        return it != transitions_.end();
    };

    if (!cond) {
        transitions_.emplace_back(std::make_pair(nullptr, state_ptr));
    } else {
        if (find_match(nullptr)) {
            // we have a slide through
            throw UserException("Unconditional transition has been assign to " + name_);
        }
        auto* ptr = cond.get();
        if (cond->width() != 1) throw VarException("Condition has to be a boolean value", {ptr});

        if (find_match(ptr)) {
            throw ::runtime_error(::format("{0} has been added to FSM {1}-{2} already",
                                           ptr->to_string(), parent_->fsm_name(), name_));
        }
        transitions_.emplace_back(std::make_pair(ptr, state_ptr));
    }
}